

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O2

char * sylvan_mt_to_str(int complement,uint32_t type,uint64_t value,char *buf,size_t buflen)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (cl_registry_count <= type) {
    __assert_fail("type < cl_registry_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mt.c"
                  ,0xc6,"char *sylvan_mt_to_str(int, uint32_t, uint64_t, char *, size_t)");
  }
  if (type == 2) {
    iVar1 = snprintf((char *)0x0,0,"%d/%u",value >> 0x20,value & 0xffffffff);
    sVar3 = (size_t)iVar1;
    if (buflen < sVar3) {
      buf = (char *)malloc(sVar3);
      buflen = sVar3;
    }
    if (buf != (char *)0x0) {
      snprintf(buf,buflen,"%d/%u",value >> 0x20,value & 0xffffffff);
      return buf;
    }
  }
  else if (type == 1) {
    iVar1 = snprintf((char *)0x0,0,"%f");
    sVar3 = (size_t)iVar1;
    if (buflen < sVar3) {
      buf = (char *)malloc(sVar3);
      buflen = sVar3;
    }
    if (buf != (char *)0x0) {
      snprintf(buf,buflen,"%f",value);
      return buf;
    }
  }
  else if (type == 0) {
    iVar1 = snprintf((char *)0x0,0,"%ld",value);
    sVar3 = (size_t)iVar1;
    if (buflen < sVar3) {
      buf = (char *)malloc(sVar3);
      buflen = sVar3;
    }
    if (buf != (char *)0x0) {
      snprintf(buf,buflen,"%ld",value);
      return buf;
    }
  }
  else if (cl_registry[type].to_str_cb != (sylvan_mt_to_str_cb)0x0) {
    pcVar2 = (*cl_registry[type].to_str_cb)(complement,value,buf,buflen);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char*
sylvan_mt_to_str(int complement, uint32_t type, uint64_t value, char* buf, size_t buflen)
{
    assert(type < cl_registry_count);
    customleaf_t *c = cl_registry + type;
    if (type == 0) {
        size_t required = (size_t)snprintf(NULL, 0, "%" PRId64, (int64_t)value);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%" PRId64, (int64_t)value);
        return ptr;
    } else if (type == 1) {
        size_t required = (size_t)snprintf(NULL, 0, "%f", *(double*)&value);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%f", *(double*)&value);
        return ptr;
    } else if (type == 2) {
        int32_t num = (int32_t)(value>>32);
        uint32_t denom = value&0xffffffff;
        size_t required = (size_t)snprintf(NULL, 0, "%" PRId32 "/%" PRIu32, num, denom);
        char *ptr = buf;
        if (buflen < required) {
            ptr = (char*)malloc(required);
            buflen = required;
        }
        if (ptr != NULL) snprintf(ptr, buflen, "%" PRId32 "/%" PRIu32, num, denom);
        return ptr;
    } else if (c->to_str_cb != NULL) {
        return c->to_str_cb(complement, value, buf, buflen);
    } else {
        return NULL;
    }
}